

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O1

void action_wiresnips(tgestate_t *state)

{
  byte bVar1;
  byte bVar2;
  uint8_t uVar3;
  long lVar4;
  char cVar5;
  int iVar6;
  wall_t *pwVar7;
  
  bVar1 = (state->hero_mappos).v;
  lVar4 = 0x10f1b8;
  cVar5 = -4;
  do {
    if ((bVar1 < *(byte *)(lVar4 + 2)) || (*(byte *)(lVar4 + 3) <= bVar1)) {
LAB_001061c3:
      lVar4 = lVar4 + 6;
      iVar6 = 0;
    }
    else {
      bVar2 = (state->hero_mappos).u;
      iVar6 = 4;
      if ((bVar2 != *(byte *)(lVar4 + 1)) && (iVar6 = 5, bVar2 - 1 != (uint)*(byte *)(lVar4 + 1)))
      goto LAB_001061c3;
    }
    if (iVar6 != 0) {
      if (iVar6 == 1) {
        return;
      }
      if (iVar6 == 4) {
        uVar3 = '\x04';
      }
      else {
        uVar3 = '\x06';
      }
      goto LAB_0010622b;
    }
    cVar5 = cVar5 + '\x01';
  } while (cVar5 != '\0');
  bVar2 = (state->hero_mappos).u;
  pwVar7 = walls + 0x10;
  cVar5 = -3;
  do {
    if ((bVar2 < pwVar7->minx) || (pwVar7->maxx <= bVar2)) {
LAB_00106208:
      pwVar7 = pwVar7 + 1;
      iVar6 = 0;
    }
    else {
      iVar6 = 8;
      if ((bVar1 != pwVar7->miny) && (iVar6 = 9, bVar1 - 1 != (uint)pwVar7->miny))
      goto LAB_00106208;
    }
    if (iVar6 != 0) {
      if (iVar6 == 1) {
        return;
      }
      if (iVar6 == 8) {
        uVar3 = '\x05';
      }
      else {
        uVar3 = '\a';
      }
LAB_0010622b:
      state->vischars[0].direction = uVar3;
      state->vischars[0].input = 0x80;
      state->vischars[0].flags = '\x02';
      state->vischars[0].mi.mappos.w = 0xc;
      state->vischars[0].mi.sprite = sprites + 2;
      state->player_locked_out_until = state->game_counter + '`';
      queue_message(state,message_CUTTING_THE_WIRE);
      return;
    }
    cVar5 = cVar5 + '\x01';
    if (cVar5 == '\0') {
      return;
    }
  } while( true );
}

Assistant:

void action_wiresnips(tgestate_t *state)
{
  const wall_t    *wall;   /* was HL */
  const mappos8_t *mappos; /* was DE */
  uint8_t          iters;  /* was B */
  uint8_t          flag;   /* was A */

  assert(state != NULL);

  wall = &walls[12]; /* start of (vertical) fences */
  mappos = &state->hero_mappos;
  iters = 4;
  do
  {
    uint8_t coord; /* was A */

    // check: this is using x then y which is the wrong order, isn't it?
    coord = mappos->v;
    if (coord >= wall->miny && coord < wall->maxy) /* Conv: Reversed test order. */
    {
      coord = mappos->u;
      if (coord == wall->maxx)
        goto snips_crawl_tl;
      if (coord - 1 == wall->maxx)
        goto snips_crawl_br;
    }

    wall++;
  }
  while (--iters);

  wall = &walls[12 + 4]; /* start of (horizontal) fences */
  mappos = &state->hero_mappos;
  iters = 3;
  do
  {
    uint8_t coord; /* was A */

    coord = mappos->u;
    if (coord >= wall->minx && coord < wall->maxx)
    {
      coord = mappos->v;
      if (coord == wall->miny)
        goto snips_crawl_tr;
      if (coord - 1 == wall->miny)
        goto snips_crawl_bl;
    }

    wall++;
  }
  while (--iters);

  return;

snips_crawl_tl: /* Crawl TL */
  flag = direction_TOP_LEFT | vischar_DIRECTION_CRAWL;
  goto action_wiresnips_tail;

snips_crawl_tr: /* Crawl TR */
  flag = direction_TOP_RIGHT | vischar_DIRECTION_CRAWL;
  goto action_wiresnips_tail;

snips_crawl_br: /* Crawl BR */
  flag = direction_BOTTOM_RIGHT | vischar_DIRECTION_CRAWL;
  goto action_wiresnips_tail;

snips_crawl_bl: /* Crawl BL */
  flag = direction_BOTTOM_LEFT | vischar_DIRECTION_CRAWL;

action_wiresnips_tail:
  state->vischars[0].direction   = flag; // dir + walk/crawl flag
  state->vischars[0].input       = input_KICK;
  state->vischars[0].flags       = vischar_FLAGS_CUTTING_WIRE;
  state->vischars[0].mi.mappos.w = 12; // crawling height
  state->vischars[0].mi.sprite   = &sprites[sprite_PRISONER_FACING_AWAY_1];
  state->player_locked_out_until = state->game_counter + 96;
  queue_message(state, message_CUTTING_THE_WIRE);
}